

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

int uv_random(uv_loop_t *loop,uv_random_t *req,void *buf,size_t buflen,uint flags,uv_random_cb cb)

{
  int iVar1;
  
  iVar1 = -7;
  if ((buflen < 0x80000000) && (iVar1 = -0x16, flags == 0)) {
    if (cb == (uv_random_cb)0x0) {
      iVar1 = uv__random(buf,buflen);
      return iVar1;
    }
    req->type = UV_RANDOM;
    (loop->active_reqs).count = (loop->active_reqs).count + 1;
    req->loop = loop;
    req->status = 0;
    req->cb = cb;
    req->buf = buf;
    req->buflen = buflen;
    iVar1 = 0;
    uv__work_submit(loop,&req->work_req,UV__WORK_CPU,uv__random_work,uv__random_done);
  }
  return iVar1;
}

Assistant:

int uv_random(uv_loop_t* loop,
              uv_random_t* req,
              void *buf,
              size_t buflen,
              unsigned flags,
              uv_random_cb cb) {
  if (buflen > 0x7FFFFFFFu)
    return UV_E2BIG;

  if (flags != 0)
    return UV_EINVAL;

  if (cb == NULL)
    return uv__random(buf, buflen);

  uv__req_init(loop, req, UV_RANDOM);
  req->loop = loop;
  req->status = 0;
  req->cb = cb;
  req->buf = buf;
  req->buflen = buflen;

  uv__work_submit(loop,
                  &req->work_req,
                  UV__WORK_CPU,
                  uv__random_work,
                  uv__random_done);

  return 0;
}